

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtendedKalmanFilter.cpp
# Opt level: O1

bool __thiscall
iDynTree::DiscreteExtendedKalmanFilterHelper::ekfInit(DiscreteExtendedKalmanFilterHelper *this)

{
  bool bVar1;
  
  if (((this->m_dim_X == 0) || (this->m_dim_Y == 0)) || (this->m_dim_U == 0)) {
    iDynTree::reportError
              ("DiscreteExtendedKalmanFilterHelper","init",
               "state or input or output size not set, exiting.");
    bVar1 = false;
  }
  else {
    iDynTree::VectorDynSize::resize((ulong)&this->m_x);
    iDynTree::VectorDynSize::zero();
    iDynTree::VectorDynSize::resize((ulong)&this->m_xhat);
    iDynTree::VectorDynSize::zero();
    iDynTree::VectorDynSize::resize((ulong)&this->m_u);
    iDynTree::VectorDynSize::zero();
    iDynTree::VectorDynSize::resize((ulong)&this->m_y);
    iDynTree::VectorDynSize::zero();
    iDynTree::MatrixDynSize::resize((ulong)&this->m_F,this->m_dim_X);
    iDynTree::MatrixDynSize::zero();
    iDynTree::MatrixDynSize::resize((ulong)&this->m_P,this->m_dim_X);
    iDynTree::MatrixDynSize::zero();
    iDynTree::MatrixDynSize::resize((ulong)&this->m_Phat,this->m_dim_X);
    iDynTree::MatrixDynSize::zero();
    iDynTree::MatrixDynSize::resize((ulong)&this->m_Q,this->m_dim_X);
    iDynTree::MatrixDynSize::zero();
    iDynTree::MatrixDynSize::resize((ulong)&this->m_H,this->m_dim_Y);
    iDynTree::MatrixDynSize::zero();
    iDynTree::MatrixDynSize::resize((ulong)&this->m_S,this->m_dim_Y);
    iDynTree::MatrixDynSize::zero();
    iDynTree::MatrixDynSize::resize((ulong)&this->m_K,this->m_dim_X);
    iDynTree::MatrixDynSize::zero();
    iDynTree::MatrixDynSize::resize((ulong)&this->m_R,this->m_dim_Y);
    iDynTree::MatrixDynSize::zero();
    this->m_is_initialized = true;
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool iDynTree::DiscreteExtendedKalmanFilterHelper::ekfInit()
{
    if (m_dim_X == 0 || m_dim_Y == 0 || m_dim_U == 0)
    {
        iDynTree::reportError("DiscreteExtendedKalmanFilterHelper", "init", "state or input or output size not set, exiting.");
        return false;
    }

    // resize state related quantities
    m_x.resize(m_dim_X); m_x.zero();
    m_xhat.resize(m_dim_X); m_xhat.zero();
    m_u.resize(m_dim_U); m_u.zero();
    m_y.resize(m_dim_Y); m_y.zero();

    m_F.resize(m_dim_X, m_dim_X);
    m_F.zero();
    m_P.resize(m_dim_X, m_dim_X);
    m_P.zero();
    m_Phat.resize(m_dim_X, m_dim_X);
    m_Phat.zero();
    m_Q.resize(m_dim_X, m_dim_X);
    m_Q.zero();

    m_H.resize(m_dim_Y, m_dim_X);
    m_H.zero();
    m_S.resize(m_dim_Y, m_dim_Y);
    m_S.zero();
    m_K.resize(m_dim_X, m_dim_Y);
    m_K.zero();
    m_R.resize(m_dim_Y, m_dim_Y);
    m_R.zero();

    m_is_initialized = true;
    return m_is_initialized;
}